

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::doVisitSwitch(Graph *this,Switch *curr)

{
  size_t *psVar1;
  size_t sVar2;
  pointer ppNVar3;
  mapped_type *this_00;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  undefined1 local_90 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  targets;
  undefined1 auStack_48 [8];
  Name target;
  
  Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
            ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->condition);
  if ((this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_90 = (undefined1  [8])&targets._M_h._M_rehash_policy._M_next_resize;
    targets._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    targets._M_h._M_bucket_count = 0;
    targets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    targets._M_h._M_element_count._0_4_ = 0x3f800000;
    targets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    targets._M_h._M_rehash_policy._4_4_ = 0;
    targets._M_h._M_rehash_policy._M_next_resize = 0;
    sVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    if (sVar2 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
            <= uVar6) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                       );
        }
        psVar1 = (size_t *)
                 ((long)&(((curr->targets).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data)->
                         super_IString).str._M_len + lVar5);
        auStack_48 = (undefined1  [8])*psVar1;
        target.super_IString.str._M_len = psVar1[1];
        targets._M_h._M_single_bucket = (__node_base_ptr)local_90;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_90,auStack_48,&targets._M_h._M_single_bucket);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (sVar2 != uVar6);
    }
    auStack_48 = (undefined1  [8])local_90;
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)auStack_48,&curr->default_);
    if (targets._M_h._M_bucket_count != 0) {
      plVar4 = (long *)targets._M_h._M_bucket_count;
      do {
        auStack_48 = (undefined1  [8])plVar4[1];
        target.super_IString.str._M_len = plVar4[2];
        this_00 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->breakStates,(key_type *)auStack_48);
        std::
        vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
        ::push_back(this_00,&this->locals);
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_90);
    ppNVar3 = (this->locals).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar3) {
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar3;
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitSwitch(Switch* curr) {
    visit(curr->condition);
    if (!isInUnreachable()) {
      std::unordered_set<Name> targets;
      for (auto target : curr->targets) {
        targets.insert(target);
      }
      targets.insert(curr->default_);
      for (auto target : targets) {
        breakStates[target].push_back(locals);
      }
    }
    setInUnreachable();
    return &bad;
  }